

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O1

void tcg_out_ctz(TCGContext_conflict9 *s,int rexw,TCGReg dest,TCGReg arg1,TCGArg arg2,_Bool const_a2
                )

{
  byte *pbVar1;
  char cVar2;
  
  cVar2 = (char)dest;
  if (have_bmi1_tricore) {
    tcg_out_opc(s,rexw + 0x201bc,dest,arg1,0);
    pbVar1 = s->code_ptr;
    s->code_ptr = pbVar1 + 1;
    *pbVar1 = ((byte)arg1 & 7) + cVar2 * '\b' | 0xc0;
    if (!const_a2) {
      tcg_out_opc(s,rexw | 0x142,dest,(int)arg2,0);
      pbVar1 = s->code_ptr;
      s->code_ptr = pbVar1 + 1;
      *pbVar1 = (byte)arg2 & 7 | cVar2 * '\b' | 0xc0;
    }
  }
  else {
    tcg_out_opc(s,rexw + 0x1bc,dest,arg1,0);
    pbVar1 = s->code_ptr;
    s->code_ptr = pbVar1 + 1;
    *pbVar1 = ((byte)arg1 & 7) + cVar2 * '\b' | 0xc0;
    tcg_out_opc(s,rexw | 0x144,dest,(int)arg2,0);
    pbVar1 = s->code_ptr;
    s->code_ptr = pbVar1 + 1;
    *pbVar1 = ((byte)arg2 & 7) + cVar2 * '\b' | 0xc0;
  }
  return;
}

Assistant:

static void tcg_out_ctz(TCGContext *s, int rexw, TCGReg dest, TCGReg arg1,
                        TCGArg arg2, bool const_a2)
{
    if (have_bmi1) {
        tcg_out_modrm(s, OPC_TZCNT + rexw, dest, arg1);
        if (const_a2) {
            tcg_debug_assert(arg2 == (rexw ? 64 : 32));
        } else {
            tcg_debug_assert(dest != arg2);
            tcg_out_cmov(s, TCG_COND_LTU, rexw, dest, arg2);
        }
    } else {
        tcg_debug_assert(dest != arg2);
        tcg_out_modrm(s, OPC_BSF + rexw, dest, arg1);
        tcg_out_cmov(s, TCG_COND_EQ, rexw, dest, arg2);
    }
}